

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

uint64_t __thiscall leveldb::anon_unknown_2::FileState::Size(FileState *this)

{
  uint64_t uVar1;
  MutexLock local_18;
  MutexLock lock;
  FileState *this_local;
  
  lock.mu_ = &this->refs_mutex_;
  MutexLock::MutexLock(&local_18,&this->blocks_mutex_);
  uVar1 = this->size_;
  MutexLock::~MutexLock(&local_18);
  return uVar1;
}

Assistant:

uint64_t Size() const {
    MutexLock lock(&blocks_mutex_);
    return size_;
  }